

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O2

size_t __thiscall
libDAI::JTree::findEfficientTree(JTree *this,VarSet *ns,DEdgeVec *Tree,size_t PreviousRoot)

{
  long *plVar1;
  pointer pDVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar6;
  size_type sVar7;
  __normal_iterator<libDAI::DEdge_*,_std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>_>
  _Var8;
  size_t *psVar9;
  size_t alpha;
  ulong uVar10;
  long lVar11;
  pointer pDVar12;
  long lVar13;
  pointer __x;
  _Base_ptr p_Var14;
  pointer n;
  long lVar15;
  long lVar16;
  key_type *__x_00;
  size_t local_f0;
  DEdgeVec newTree;
  set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_> subTree;
  VarSet nsrem;
  Graph oldTree;
  
  lVar15 = 0;
  p_Var14 = (_Base_ptr)0x0;
  local_f0 = 0;
  for (uVar10 = 0;
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this),
      uVar10 < (ulong)(*(long *)(CONCAT44(extraout_var,iVar5) + 0xe8) -
                       *(long *)(CONCAT44(extraout_var,iVar5) + 0xe0) >> 6); uVar10 = uVar10 + 1) {
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    VarSet::operator&((VarSet *)&oldTree,ns,
                      (VarSet *)(*(long *)(CONCAT44(extraout_var_00,iVar5) + 0xe0) + lVar15));
    p_Var3 = oldTree._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&oldTree);
    if (p_Var14 < p_Var3) {
      local_f0 = uVar10;
      p_Var14 = p_Var3;
    }
    lVar15 = lVar15 + 0x40;
  }
  oldTree._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &oldTree._M_t._M_impl.super__Rb_tree_header._M_header;
  oldTree._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  oldTree._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  oldTree._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  oldTree._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       oldTree._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pDVar12 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pDVar12 !=
      (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
      super__Vector_impl_data._M_finish; pDVar12 = pDVar12 + 1) {
    subTree._M_t._M_impl._0_8_ = pDVar12->n1;
    subTree._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pDVar12->n2;
    std::
    _Rb_tree<libDAI::UEdge,_libDAI::UEdge,_std::_Identity<libDAI::UEdge>,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
    ::_M_insert_unique<libDAI::UEdge>(&oldTree._M_t,(UEdge *)&subTree);
  }
  GrowRootedTree(&newTree,&oldTree,local_f0);
  iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  VarSet::operator/(&nsrem,ns,
                    (VarSet *)(local_f0 * 0x40 + *(long *)(CONCAT44(extraout_var_01,iVar5) + 0xe0)))
  ;
  subTree._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &subTree._M_t._M_impl.super__Rb_tree_header._M_header;
  subTree._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       subTree._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  subTree._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  subTree._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  n = nsrem._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start;
  subTree._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       subTree._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_004ec124:
  if (n != nsrem._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    lVar15 = 8;
    lVar11 = 0;
    for (lVar16 = 0;
        lVar16 != (long)newTree.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)newTree.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4; lVar16 = lVar16 + 1) {
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      bVar4 = VarSet::operator&&((VarSet *)
                                 (*(long *)((long)&(newTree.
                                                  super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->n1 +
                                           lVar15) * 0x40 +
                                 *(long *)(CONCAT44(extraout_var_02,iVar5) + 0xe0)),n);
      if (bVar4) break;
      lVar11 = lVar11 + -0x10;
      lVar15 = lVar15 + 0x10;
    }
    std::
    _Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
    ::_M_insert_unique<libDAI::DEdge_const&>
              ((_Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
                *)&subTree,
               (DEdge *)((long)newTree.
                               super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                               _M_impl.super__Vector_impl_data._M_start - lVar11));
    plVar6 = (long *)((long)newTree.
                            super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                            _M_impl.super__Vector_impl_data._M_start - lVar11);
    do {
      lVar13 = -lVar16;
      lVar11 = lVar16 * -0x10;
      lVar15 = lVar16 * 0x10 + -8;
      do {
        lVar13 = lVar13 + 1;
        if (lVar13 == 1) {
          n = n + 1;
          goto LAB_004ec124;
        }
        lVar11 = lVar11 + 0x10;
        plVar1 = (long *)((long)&(newTree.
                                  super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->n1 + lVar15);
        lVar15 = lVar15 + -0x10;
      } while (*plVar1 != *plVar6);
      std::
      _Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
      ::_M_insert_unique<libDAI::DEdge_const&>
                ((_Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
                  *)&subTree,
                 (DEdge *)((long)newTree.
                                 super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                                 _M_impl.super__Vector_impl_data._M_start - lVar11));
      lVar16 = -lVar13;
      plVar6 = (long *)((long)newTree.
                              super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                              _M_impl.super__Vector_impl_data._M_start - lVar11);
    } while( true );
  }
  if ((PreviousRoot != 0xffffffffffffffff) && (local_f0 != PreviousRoot)) {
    lVar15 = 0;
    lVar11 = (long)newTree.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)newTree.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl
                   .super__Vector_impl_data._M_start >> 4;
    for (psVar9 = &(newTree.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                    _M_impl.super__Vector_impl_data._M_start)->n2;
        (lVar16 = lVar11, lVar11 != lVar15 && (lVar16 = lVar15, *psVar9 != PreviousRoot));
        psVar9 = psVar9 + 2) {
      lVar15 = lVar15 + 1;
    }
    std::
    _Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
    ::_M_insert_unique<libDAI::DEdge_const&>
              ((_Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
                *)&subTree,
               newTree.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
               super__Vector_impl_data._M_start + lVar16);
    pDVar12 = newTree.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
              super__Vector_impl_data._M_start + lVar16;
    do {
      lVar11 = -lVar16;
      lVar13 = lVar16 * -0x10;
      lVar15 = lVar16 * 0x10 + -8;
      do {
        lVar11 = lVar11 + 1;
        if (lVar11 == 1) goto LAB_004ec2b6;
        lVar13 = lVar13 + 0x10;
        psVar9 = (size_t *)
                 ((long)&(newTree.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                          _M_impl.super__Vector_impl_data._M_start)->n1 + lVar15);
        lVar15 = lVar15 + -0x10;
      } while (*psVar9 != pDVar12->n1);
      std::
      _Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
      ::_M_insert_unique<libDAI::DEdge_const&>
                ((_Rb_tree<libDAI::DEdge,libDAI::DEdge,std::_Identity<libDAI::DEdge>,std::less<libDAI::DEdge>,std::allocator<libDAI::DEdge>>
                  *)&subTree,
                 (DEdge *)((long)newTree.
                                 super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                                 _M_impl.super__Vector_impl_data._M_start - lVar13));
      lVar16 = -lVar11;
      pDVar12 = (pointer)((long)newTree.
                                super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                                _M_impl.super__Vector_impl_data._M_start - lVar13);
    } while( true );
  }
LAB_004ec2b6:
  pDVar12 = (Tree->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((Tree->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
      super__Vector_impl_data._M_finish != pDVar12) {
    (Tree->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
    super__Vector_impl_data._M_finish = pDVar12;
  }
  for (__x_00 = newTree.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                super__Vector_impl_data._M_start;
      __x_00 != newTree.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                super__Vector_impl_data._M_finish; __x_00 = __x_00 + 1) {
    sVar7 = std::set<libDAI::DEdge,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_>::count
                      (&subTree,__x_00);
    if (sVar7 != 0) {
      std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::push_back(Tree,__x_00);
    }
  }
  pDVar12 = (Tree->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pDVar2 = (Tree->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = newTree.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
             super__Vector_impl_data._M_start; __x != __x_00; __x = __x + 1) {
    _Var8 = std::
            __find_if<__gnu_cxx::__normal_iterator<libDAI::DEdge*,std::vector<libDAI::DEdge,std::allocator<libDAI::DEdge>>>,__gnu_cxx::__ops::_Iter_equals_val<libDAI::DEdge_const>>
                      ((Tree->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
                       _M_impl.super__Vector_impl_data._M_start,
                       (Tree->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
                       _M_impl.super__Vector_impl_data._M_finish,__x);
    if (_Var8._M_current ==
        (Tree->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::push_back(Tree,__x);
    }
    __x_00 = newTree.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  std::
  _Rb_tree<libDAI::DEdge,_libDAI::DEdge,_std::_Identity<libDAI::DEdge>,_std::less<libDAI::DEdge>,_std::allocator<libDAI::DEdge>_>
  ::~_Rb_tree(&subTree._M_t);
  std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
            ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&nsrem);
  std::_Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::~_Vector_base
            (&newTree.super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>);
  std::
  _Rb_tree<libDAI::UEdge,_libDAI::UEdge,_std::_Identity<libDAI::UEdge>,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
  ::~_Rb_tree(&oldTree._M_t);
  return (long)pDVar2 - (long)pDVar12 >> 4;
}

Assistant:

size_t JTree::findEfficientTree( const VarSet& ns, DEdgeVec &Tree, size_t PreviousRoot ) const {
        // find new root clique (the one with maximal statespace overlap with ns)
        size_t maxval = 0, maxalpha = 0;
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ ) {
            size_t val = (ns & grm().OR(alpha).vars()).stateSpace();
            if( val > maxval ) {
                maxval = val;
                maxalpha = alpha;
            }
        }

    //  for( size_t e = 0; e < _RTree.size(); e++ )
    //      cout << grm().OR(_RTree[e].n1).vars() << "->" << grm().OR(_RTree[e].n2).vars() << ",  ";
    //  cout << endl;
        // grow new tree
        Graph oldTree;
        for( DEdgeVec::const_iterator e = _RTree.begin(); e != _RTree.end(); e++ )
            oldTree.insert( UEdge(e->n1, e->n2) );
        DEdgeVec newTree = GrowRootedTree( oldTree, maxalpha );
    //  cout << ns << ": ";
    //  for( size_t e = 0; e < newTree.size(); e++ )
    //      cout << grm().OR(newTree[e].n1).vars() << "->" << grm().OR(newTree[e].n2).vars() << ",  ";
    //  cout << endl;
        
        // identify subtree that contains variables of ns which are not in the new root
        VarSet nsrem = ns / grm().OR(maxalpha).vars();
    //  cout << "nsrem:" << nsrem << endl;
        set<DEdge> subTree;
        // for each variable in ns that is not in the root clique
        for( VarSet::const_iterator n = nsrem.begin(); n != nsrem.end(); n++ ) {
            // find first occurence of *n in the tree, which is closest to the root
            size_t e = 0;
            for( ; e != newTree.size(); e++ ) {
                if( grm().OR(newTree[e].n2).vars() && *n )
                    break;
            }
            assert( e != newTree.size() );

            // track-back path to root and add edges to subTree
            subTree.insert( newTree[e] );
            size_t pos = newTree[e].n1;
            for( ; e > 0; e-- )
                if( newTree[e-1].n2 == pos ) {
                    subTree.insert( newTree[e-1] );
                    pos = newTree[e-1].n1;
                }
        }
        if( PreviousRoot != (size_t)-1 && PreviousRoot != maxalpha) {
            // find first occurence of PreviousRoot in the tree, which is closest to the new root
            size_t e = 0;
            for( ; e != newTree.size(); e++ ) {
                if( newTree[e].n2 == PreviousRoot )
                    break;
            }
            assert( e != newTree.size() );

            // track-back path to root and add edges to subTree
            subTree.insert( newTree[e] );
            size_t pos = newTree[e].n1;
            for( ; e > 0; e-- )
                if( newTree[e-1].n2 == pos ) {
                    subTree.insert( newTree[e-1] );
                    pos = newTree[e-1].n1;
                }
        }
    //  cout << "subTree: " << endl;
    //  for( set<DEdge>::const_iterator sTi = subTree.begin(); sTi != subTree.end(); sTi++ )
    //      cout << grm().OR(sTi->n1).vars() << "->" << grm().OR(sTi->n2).vars() << ",  ";
    //  cout << endl;

        // Resulting Tree is a reordered copy of newTree
        // First add edges in subTree to Tree
        Tree.clear();
        for( DEdgeVec::const_iterator e = newTree.begin(); e != newTree.end(); e++ )
            if( subTree.count( *e ) ) {
                Tree.push_back( *e );
    //          cout << grm().OR(e->n1).vars() << "->" << grm().OR(e->n2).vars() << ",  ";
            }
    //  cout << endl;
        // Then add edges pointing away from nsrem
        // FIXME
    /*  for( DEdgeVec::const_iterator e = newTree.begin(); e != newTree.end(); e++ )
            for( set<DEdge>::const_iterator sTi = subTree.begin(); sTi != subTree.end(); sTi++ )
                if( *e != *sTi ) {
                    if( e->n1 == sTi->n1 || e->n1 == sTi->n2 ||
                        e->n2 == sTi->n1 || e->n2 == sTi->n2 ) {
                        Tree.push_back( *e );
    //                  cout << grm().OR(e->n1).vars() << "->" << grm().OR(e->n2).vars() << ",  ";
                    }
                }*/
        // FIXME
    /*  for( DEdgeVec::const_iterator e = newTree.begin(); e != newTree.end(); e++ )
            if( find( Tree.begin(), Tree.end(), *e) == Tree.end() ) {
                bool found = false;
                for( VarSet::const_iterator n = nsrem.begin(); n != nsrem.end(); n++ )
                    if( (grm().OR(e->n1).vars() && *n) ) {
                        found = true;
                        break;
                    }
                if( found ) {
                    Tree.push_back( *e );
                    cout << grm().OR(e->n1).vars() << "->" << grm().OR(e->n2).vars() << ",  ";
                }
            }
        cout << endl;*/
        size_t subTreeSize = Tree.size();
        // Then add remaining edges
        for( DEdgeVec::const_iterator e = newTree.begin(); e != newTree.end(); e++ )
            if( find( Tree.begin(), Tree.end(), *e ) == Tree.end() )
                Tree.push_back( *e );

        return subTreeSize;
    }